

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

float get_ieee754_float(uint8_t *p)

{
  uint8_t *q;
  float f;
  uint8_t *p_local;
  
  q._7_1_ = *p;
  q._6_1_ = p[1];
  q._5_1_ = p[2];
  q._4_1_ = p[3];
  return q._4_4_;
}

Assistant:

static float get_ieee754_float(const uint8_t *restrict p) {
    volatile float f;
    volatile uint8_t *q = (volatile void *)&f;
/* Windows builds don't use autoconf but we can assume they're all
 * little-endian. */
#if MMDB_LITTLE_ENDIAN || _WIN32
    q[3] = p[0];
    q[2] = p[1];
    q[1] = p[2];
    q[0] = p[3];
#else
    memcpy(q, p, 4);
#endif
    return f;
}